

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

uint64_t __thiscall
anon_unknown.dwarf_10ddcf::hash_function::operator()(hash_function *this,string *str)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  string *str_local;
  hash_function *this_local;
  
  it._M_node = (_Base_ptr)str;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(this->map_,str);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(this->map_);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (!bVar1) {
    pstore::assert_failed
              ("it != map_.end ()",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x10d);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
           ::operator->(&local_20);
  return ppVar2->second;
}

Assistant:

std::uint64_t operator() (std::string const & str) const {
            auto it = map_.find (str);
            PSTORE_ASSERT (it != map_.end ());
            return it->second;
        }